

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

_Bool is_fatal_error(CURLcode code)

{
  _Bool local_9;
  CURLcode code_local;
  
  if ((((code == CURLE_FAILED_INIT) || (code == CURLE_OUT_OF_MEMORY)) ||
      (code == CURLE_FUNCTION_NOT_FOUND)) ||
     ((code == CURLE_BAD_FUNCTION_ARGUMENT || (code == CURLE_UNKNOWN_OPTION)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool is_fatal_error(CURLcode code)
{
  switch(code) {
  /* TODO: Should CURLE_SSL_CACERT be included as critical error ? */
  case CURLE_FAILED_INIT:
  case CURLE_OUT_OF_MEMORY:
  case CURLE_UNKNOWN_OPTION:
  case CURLE_FUNCTION_NOT_FOUND:
  case CURLE_BAD_FUNCTION_ARGUMENT:
    /* critical error */
    return TRUE;
  default:
    break;
  }

  /* no error or not critical */
  return FALSE;
}